

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBToARGB4444Row_C(uint8 *src_argb,uint8 *dst_rgb,int width)

{
  uint8 a0_1;
  uint8 r0_1;
  uint8 g0_1;
  uint8 b0_1;
  uint8 a1;
  uint8 r1;
  uint8 g1;
  uint8 b1;
  uint8 a0;
  uint8 r0;
  uint8 g0;
  uint8 b0;
  int x;
  int width_local;
  uint8 *dst_rgb_local;
  uint8 *src_argb_local;
  
  _x = (uint *)dst_rgb;
  dst_rgb_local = src_argb;
  for (_a1 = 0; _a1 < width + -1; _a1 = _a1 + 2) {
    *_x = (int)(uint)*dst_rgb_local >> 4 | ((int)(uint)dst_rgb_local[1] >> 4) << 4 |
          ((int)(uint)dst_rgb_local[2] >> 4) << 8 | ((int)(uint)dst_rgb_local[3] >> 4) << 0xc |
          ((int)(uint)dst_rgb_local[4] >> 4) << 0x10 | ((int)(uint)dst_rgb_local[5] >> 4) << 0x14 |
          ((int)(uint)dst_rgb_local[6] >> 4) << 0x18 | ((int)(uint)dst_rgb_local[7] >> 4) << 0x1c;
    _x = _x + 1;
    dst_rgb_local = dst_rgb_local + 8;
  }
  if ((width & 1U) != 0) {
    *(ushort *)_x =
         (ushort)(byte)((int)(uint)*dst_rgb_local >> 4) |
         (ushort)(byte)((int)(uint)dst_rgb_local[1] >> 4) << 4 |
         (ushort)(byte)((int)(uint)dst_rgb_local[2] >> 4) << 8 |
         (ushort)(byte)((int)(uint)dst_rgb_local[3] >> 4) << 0xc;
  }
  return;
}

Assistant:

void ARGBToARGB4444Row_C(const uint8* src_argb, uint8* dst_rgb, int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8 b0 = src_argb[0] >> 4;
    uint8 g0 = src_argb[1] >> 4;
    uint8 r0 = src_argb[2] >> 4;
    uint8 a0 = src_argb[3] >> 4;
    uint8 b1 = src_argb[4] >> 4;
    uint8 g1 = src_argb[5] >> 4;
    uint8 r1 = src_argb[6] >> 4;
    uint8 a1 = src_argb[7] >> 4;
    *(uint32*)(dst_rgb) = b0 | (g0 << 4) | (r0 << 8) | (a0 << 12) | (b1 << 16) |
                          (g1 << 20) | (r1 << 24) | (a1 << 28);
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    uint8 b0 = src_argb[0] >> 4;
    uint8 g0 = src_argb[1] >> 4;
    uint8 r0 = src_argb[2] >> 4;
    uint8 a0 = src_argb[3] >> 4;
    *(uint16*)(dst_rgb) = b0 | (g0 << 4) | (r0 << 8) | (a0 << 12);
  }
}